

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::email::email(email *this)

{
  string local_38;
  
  base_widget::base_widget
            ((base_widget *)&(this->super_regex_field).super_text.super_base_html_input.field_0xa0);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"^[^@]+@[^@]+$","");
  regex_field::regex_field(&this->super_regex_field,&PTR_construction_vtable_24__00286f20,&local_38)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_regex_field).super_text.super_base_html_input._vptr_base_html_input =
       (_func_int **)0x286e08;
  *(undefined8 *)&(this->super_regex_field).super_text.super_base_html_input.field_0xa0 = 0x286ec8;
  *(undefined8 *)&(this->super_regex_field).super_text.super_base_html_input.field_0x30 = 0x286e50;
  *(undefined8 *)&(this->super_regex_field).super_text.super_base_html_input.field_0x98 = 0;
  return;
}

Assistant:

email::email() : regex_field("^[^@]+@[^@]+$") {}